

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

double gmath::transformGaussJordan(Matrixd *a)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  uint uVar20;
  double *pdVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  
  uVar4 = a->nrows;
  uVar8 = (ulong)(int)uVar4;
  uVar5 = a->ncols;
  if ((long)uVar8 < 1) {
    pdVar9 = a->v;
    dVar24 = 0.0;
  }
  else {
    pdVar9 = a->v;
    uVar16 = 0;
    pdVar18 = pdVar9;
    dVar23 = 0.0;
    do {
      dVar24 = 0.0;
      if (0 < (int)uVar5) {
        uVar19 = 0;
        do {
          dVar24 = dVar24 + ABS(pdVar18[uVar19]);
          uVar19 = uVar19 + 1;
        } while (uVar5 != uVar19);
      }
      if (dVar24 <= dVar23) {
        dVar24 = dVar23;
      }
      uVar16 = uVar16 + 1;
      pdVar18 = pdVar18 + uVar5;
      dVar23 = dVar24;
    } while (uVar16 != uVar8);
  }
  uVar6 = uVar4;
  uVar7 = uVar5;
  if ((int)uVar5 < (int)uVar4) {
    uVar6 = uVar5;
    uVar7 = uVar4;
  }
  if ((int)uVar6 < 1) {
    dVar23 = 1.0;
  }
  else {
    lVar17 = (long)(int)uVar5;
    uVar19 = (ulong)uVar5;
    pdVar18 = pdVar9 + lVar17;
    uVar20 = 1;
    dVar23 = 1.0;
    uVar16 = 0;
    pdVar21 = pdVar9;
    pdVar22 = pdVar9;
    do {
      uVar1 = uVar16 + 1;
      uVar12 = uVar16 & 0xffffffff;
      pdVar14 = pdVar18;
      uVar10 = uVar20;
      if ((long)uVar1 < (long)uVar8) {
        do {
          uVar15 = uVar10;
          if (ABS(*pdVar14) <= ABS(pdVar9[(long)(int)(uVar5 * (uint)uVar12) + uVar16])) {
            uVar15 = (uint)uVar12;
          }
          uVar10 = uVar10 + 1;
          pdVar14 = pdVar14 + lVar17;
          uVar12 = (ulong)uVar15;
        } while (uVar4 != uVar10);
      }
      lVar11 = (long)(int)((int)uVar12 * uVar5);
      if (ABS(pdVar9[uVar16 + lVar11]) < dVar24 * (double)(int)uVar7 * 2.220446049250313e-16) {
        return 0.0;
      }
      if (uVar16 != uVar12) {
        if ((long)uVar16 < lVar17) {
          uVar12 = 0;
          do {
            dVar2 = pdVar22[uVar12];
            pdVar22[uVar12] = pdVar21[lVar11 + uVar12];
            pdVar21[lVar11 + uVar12] = dVar2;
            uVar12 = uVar12 + 1;
          } while (uVar19 != uVar12);
        }
        dVar23 = -dVar23;
      }
      dVar2 = pdVar9[(long)(int)(uVar5 * (int)uVar16) + uVar16];
      if ((long)uVar16 < lVar17) {
        uVar12 = 0;
        do {
          pdVar22[uVar12] = pdVar22[uVar12] / dVar2;
          uVar12 = uVar12 + 1;
        } while (uVar19 != uVar12);
      }
      if (0 < (int)uVar4) {
        uVar12 = 0;
        pdVar14 = pdVar21;
        do {
          if ((uVar12 != uVar16) && ((long)uVar16 < lVar17)) {
            dVar3 = pdVar9[uVar12 * lVar17 + uVar16];
            uVar13 = 0;
            do {
              pdVar14[uVar13] = pdVar22[uVar13] * -dVar3 + pdVar14[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar19 != uVar13);
          }
          uVar12 = uVar12 + 1;
          pdVar14 = pdVar14 + lVar17;
        } while (uVar12 != uVar8);
      }
      dVar23 = dVar23 * dVar2;
      uVar20 = uVar20 + 1;
      pdVar18 = pdVar18 + lVar17 + 1;
      pdVar22 = pdVar22 + lVar17 + 1;
      pdVar21 = pdVar21 + 1;
      uVar19 = uVar19 - 1;
      uVar16 = uVar1;
    } while (uVar1 != uVar6);
  }
  return dVar23;
}

Assistant:

double transformGaussJordan(Matrixd &a)
{
  double ret=1;

  // compute a meaningful epsilon

  double eps=0;

  for (int k=0; k<a.rows(); k++)
  {
    double v=0;

    for (int i=0; i<a.cols(); i++)
    {
      v+=std::abs(a(k, i));
    }

    eps=std::max(eps, v);
  }

  int n=std::max(a.rows(), a.cols());

  eps*=n;
  eps*=pow(2, -52);

  // for all rows

  n=std::min(a.rows(), a.cols());

  for (int j=0; j<n; j++)
  {
    // find pivot element

    int pivot=j;

    for (int k=j+1; k<a.rows(); k++)
    {
      if (std::abs(a(k, j)) > std::abs(a(pivot, j)))
      {
        pivot=k;
      }
    }

    // stop, if pivot element is 0

    if (std::abs(a(pivot, j)) < eps)
    {
      ret=0;
      break;
    }

    // interchange line j with line with pivot element

    if (pivot != j)
    {
      for (int i=j; i<a.cols(); i++)
      {
        double v=a(j, i);
        a(j, i)=a(pivot, i);
        a(pivot, i)=v;
      }

      ret*=-1;
    }

    pivot=j;

    // scale pivot line such that the pivot element becomes 1

    double s=a(pivot, pivot);

    for (int i=pivot; i<a.cols(); i++)
    {
      a(pivot, i)/=s;
    }

    ret*=s;

    // eliminate all elements of the pivot column except the pivot
    // element

    for (int k=0; k<a.rows(); k++)
    {
      if (k != pivot)
      {
        double v=a(k, pivot);

        for (int i=pivot; i<a.cols(); i++)
        {
          a(k, i)-=v*a(pivot, i);
        }
      }
    }
  }

  return ret;
}